

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

bool Js::InterpreterStackFrame::ShouldDoProfile(FunctionBody *executeFunction)

{
  ExecutionMode EVar1;
  bool bVar2;
  
  EVar1 = FunctionBody::GetInterpreterExecutionMode(executeFunction,false);
  bVar2 = true;
  if (EVar1 != ProfilingInterpreter) {
    bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)executeFunction);
    if (bVar2) {
      bVar2 = DynamicProfileInfo::IsEnabled(executeFunction);
      return bVar2;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool InterpreterStackFrame::ShouldDoProfile(FunctionBody* executeFunction)
    {
#if ENABLE_PROFILE_INFO
        const bool doProfile = executeFunction->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (executeFunction->IsInDebugMode() && DynamicProfileInfo::IsEnabled(executeFunction));
        return doProfile;
#else
        return false;
#endif
    }